

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

Script * cfd::GetLockingScriptFromUtxoData(UtxoData *utxo)

{
  byte bVar1;
  ulong uVar2;
  long in_RSI;
  Script *in_RDI;
  Descriptor desc;
  Script *locking_script;
  undefined7 in_stack_fffffffffffffdc0;
  Script local_228;
  Descriptor local_1f0;
  Script local_80;
  string local_38;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  core::Script::Script(in_RDI,(Script *)(in_RSI + 0x50));
  core::Address::GetAddress_abi_cxx11_(&local_38,(Address *)(local_10 + 0xc0));
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)&local_38);
  if ((bVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      core::Descriptor::ParseElements(&local_1f0,(string *)(local_10 + 0x240));
      core::Descriptor::GetLockingScript(&local_228,&local_1f0);
      core::Script::operator=(in_RDI,&local_228);
      core::Script::~Script((Script *)CONCAT17(bVar1,in_stack_fffffffffffffdc0));
      core::Descriptor::~Descriptor((Descriptor *)0x582e58);
    }
  }
  else {
    core::Address::GetLockingScript(&local_80,(Address *)(local_10 + 0xc0));
    core::Script::operator=(in_RDI,&local_80);
    core::Script::~Script((Script *)CONCAT17(bVar1,in_stack_fffffffffffffdc0));
  }
  return in_RDI;
}

Assistant:

static Script GetLockingScriptFromUtxoData(const UtxoData& utxo) {
  Script locking_script = utxo.locking_script;
  if (!utxo.address.GetAddress().empty()) {
    locking_script = utxo.address.GetLockingScript();
  } else if (!utxo.descriptor.empty()) {
    auto desc = Descriptor::ParseElements(utxo.descriptor);
    locking_script = desc.GetLockingScript();
  }
  return locking_script;
}